

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertBinaryEqual
          (UtestShell *this,void *expected,void *actual,size_t length,char *text,char *fileName,
          int lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  TestResult *pTVar2;
  UtestShell *in_RCX;
  char *in_RDX;
  void *in_RSI;
  UtestShell *in_RDI;
  uchar *in_R9;
  undefined4 in_stack_00000008;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_fffffffffffffeb8;
  UtestShell *pUVar3;
  SimpleString *in_stack_fffffffffffffec0;
  SimpleString *this_00;
  uchar *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  void *pvVar4;
  int lineNumber_00;
  char *in_stack_ffffffffffffff20;
  BinaryEqualFailure *in_stack_ffffffffffffff30;
  undefined1 local_c8 [8];
  size_t in_stack_ffffffffffffff40;
  SimpleString *in_stack_ffffffffffffff48;
  SimpleString local_78;
  undefined1 local_70 [64];
  uchar *local_30;
  UtestShell *local_20;
  char *local_18;
  void *local_10;
  
  lineNumber_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = getTestResult(in_stack_fffffffffffffeb8);
  (*pTVar2->_vptr_TestResult[10])();
  pUVar3 = local_20;
  if ((local_18 != (char *)0x0) || (local_10 != (void *)0x0)) {
    if ((local_18 == (char *)0x0) || (this_00 = in_stack_fffffffffffffec0, local_10 == (void *)0x0))
    {
      this_00 = &local_78;
      pvVar4 = local_10;
      in_stack_ffffffffffffff20 = local_18;
      SimpleString::SimpleString(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      lineNumber_00 = (int)((ulong)pvVar4 >> 0x20);
      BinaryEqualFailure::BinaryEqualFailure
                (in_stack_ffffffffffffff30,in_RDI,in_stack_ffffffffffffff20,lineNumber_00,
                 (uchar *)CONCAT44(in_stack_00000008,in_stack_ffffffffffffff10),local_30,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
      (*in_RDI->_vptr_UtestShell[0x25])(in_RDI,local_70,in_stack_00000010);
      BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)0x219f0a);
      SimpleString::~SimpleString((SimpleString *)0x219f17);
      in_stack_fffffffffffffeb8 = pUVar3;
      in_stack_ffffffffffffff08 = local_30;
      in_stack_ffffffffffffff14 = in_stack_00000008;
    }
    iVar1 = SimpleString::MemCmp(local_10,local_18,(size_t)local_20);
    if (iVar1 != 0) {
      SimpleString::SimpleString(this_00,(char *)in_stack_fffffffffffffeb8);
      BinaryEqualFailure::BinaryEqualFailure
                (in_stack_ffffffffffffff30,in_RDI,in_stack_ffffffffffffff20,lineNumber_00,
                 (uchar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
      (*in_RDI->_vptr_UtestShell[0x25])(in_RDI,local_c8,in_stack_00000010);
      BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)0x21a049);
      SimpleString::~SimpleString((SimpleString *)0x21a053);
    }
  }
  return;
}

Assistant:

void UtestShell::assertBinaryEqual(const void *expected, const void *actual, size_t length, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == 0 && expected == 0) return;
    if (actual == 0 || expected == 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
    if (SimpleString::MemCmp(expected, actual, length) != 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
}